

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monochrome_test.cc
# Opt level: O0

void __thiscall
(anonymous_namespace)::MonochromeAllIntraTest_TestMonochromeEncoding_Test::
~MonochromeAllIntraTest_TestMonochromeEncoding_Test
          (MonochromeAllIntraTest_TestMonochromeEncoding_Test *this)

{
  MonochromeAllIntraTest_TestMonochromeEncoding_Test *in_stack_00000010;
  
  anon_unknown.dwarf_c4c24d::MonochromeAllIntraTest_TestMonochromeEncoding_Test::
  ~MonochromeAllIntraTest_TestMonochromeEncoding_Test(in_stack_00000010);
  return;
}

Assistant:

TEST_P(MonochromeAllIntraTest, TestMonochromeEncoding) {
  ::libaom_test::I420VideoSource video("hantro_collage_w352h288.yuv", 352, 288,
                                       30, 1, 0, 5);
  init_flags_ = AOM_CODEC_USE_PSNR;
  // Set monochrome encoding flag
  cfg_.monochrome = 1;
  ASSERT_NO_FATAL_FAILURE(RunLoop(&video));

  // Check that the chroma planes are equal across all frames
  std::vector<int>::const_iterator iter = chroma_value_list_.begin();
  int initial_chroma_value = *iter;
  for (; iter != chroma_value_list_.end(); ++iter) {
    // Check that all decoded frames have the same constant chroma planes.
    EXPECT_EQ(*iter, initial_chroma_value);
  }
}